

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.hpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::for_each_listen_socket
          (session_impl *this,function<void_(const_libtorrent::aux::listen_socket_handle_&)> *f)

{
  bool bVar1;
  shared_ptr<libtorrent::aux::listen_socket_t> local_58;
  listen_socket_handle local_48;
  reference local_38;
  shared_ptr<libtorrent::aux::listen_socket_t> *s;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
  *__range2;
  function<void_(const_libtorrent::aux::listen_socket_handle_&)> *f_local;
  session_impl *this_local;
  
  __end2 = std::
           vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
           ::begin(&this->m_listen_sockets);
  s = (shared_ptr<libtorrent::aux::listen_socket_t> *)
      std::
      vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
      ::end(&this->m_listen_sockets);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                                *)&s);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
               ::operator*(&__end2);
    std::shared_ptr<libtorrent::aux::listen_socket_t>::shared_ptr(&local_58,local_38);
    listen_socket_handle::listen_socket_handle(&local_48,&local_58);
    std::function<void_(const_libtorrent::aux::listen_socket_handle_&)>::operator()(f,&local_48);
    listen_socket_handle::~listen_socket_handle(&local_48);
    std::shared_ptr<libtorrent::aux::listen_socket_t>::~shared_ptr(&local_58);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void for_each_listen_socket(std::function<void(aux::listen_socket_handle const&)> f) override
			{
				for (auto& s : m_listen_sockets)
				{
					f(listen_socket_handle(s));
				}
			}